

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_map_reduce_tests.cpp
# Opt level: O0

void __thiscall
omp_tuple_reduce_tuple_one_tuple_Test::TestBody(omp_tuple_reduce_tuple_one_tuple_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_90;
  Message local_88 [3];
  double local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  int local_50 [2];
  int result;
  char local_41;
  double local_40;
  int local_34;
  undefined1 local_30 [8];
  tuple<int,_double,_char,_int,_int> expected;
  omp_tuple_reduce_tuple_one_tuple_Test *this_local;
  
  local_34 = 1;
  local_40 = 2.0;
  local_41 = 'a';
  result = 4;
  local_50[1] = 5;
  expected.super__Tuple_impl<0UL,_int,_double,_char,_int,_int>._24_8_ = this;
  std::make_tuple<int,double,char,int,int>
            ((tuple<int,_double,_char,_int,_int> *)local_30,&local_34,&local_40,&local_41,&result,
             local_50 + 1);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  local_50[0] = omp::
                tuple_reduce<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_CallOfCrutches[P]omp_utils_tests_omp_utils_tuple_map_reduce_tests_cpp:239:7),_int,_std::tuple<int,_double,_char,_int,_int>_&,_0>
                          ((anon_class_1_0_00000001 *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7),(int *)&gtest_ar.message_,
                           (tuple<int,_double,_char,_int,_int> *)local_30);
  local_70 = 109.0;
  testing::internal::EqHelper::Compare<int,_double,_nullptr>
            ((EqHelper *)local_68,"result","1 + 2.0 + \'a\' + 4 + 5",local_50,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_88);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CallOfCrutches[P]omp_utils/tests/omp/utils/tuple_map_reduce_tests.cpp"
               ,0xf1,message);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  return;
}

Assistant:

TEST(omp_tuple_reduce_tuple, one_tuple) {
  auto expected = std::make_tuple(1, 2.0, 'a', 4, 5);
  auto result = omp::tuple_reduce(
      [](auto accum, auto &val) { return accum + val; }, 0, expected);

  ASSERT_EQ(result, 1 + 2.0 + 'a' + 4 + 5);
}